

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O3

void __thiscall
google::protobuf::json_internal::ParseProto2Descriptor::SetString
          (ParseProto2Descriptor *this,Field f,Msg *msg,string_view x)

{
  ParseProto2Descriptor PVar1;
  Message *message;
  undefined8 extraout_RAX;
  size_t sVar2;
  undefined8 unaff_RBP;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Alloc_hider _Var5;
  long lVar6;
  Metadata MVar7;
  string local_80;
  string local_60;
  
  sVar2 = x._M_len;
  RecordAsSeen((Field)this,(Msg *)f);
  PVar1 = this[1];
  plVar3 = (long *)CONCAT71((int7)((ulong)unaff_RBP >> 8),PVar1);
  if (0xbf < (byte)PVar1 == (bool)(((byte)PVar1 & 0x20) >> 5)) {
    MVar7 = Message::GetMetadata(*(Message **)f);
    lVar6 = (long)&msg->msg_ + sVar2;
    message = *(Message **)f;
    if (((byte)PVar1 & 0x20) == 0) {
      paVar4 = &local_80.field_2;
      local_80._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,sVar2,lVar6);
      Reflection::SetString(MVar7.reflection,message,(FieldDescriptor *)this,&local_80);
      _Var5._M_p = local_80._M_dataplus._M_p;
    }
    else {
      paVar4 = &local_60.field_2;
      local_60._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,sVar2,lVar6);
      Reflection::AddString(MVar7.reflection,message,(FieldDescriptor *)this,&local_60);
      _Var5._M_p = local_60._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != paVar4) {
      operator_delete(_Var5._M_p,paVar4->_M_allocated_capacity + 1);
    }
    return;
  }
  SetString();
  if ((long *)local_80._M_dataplus._M_p != plVar3) {
    operator_delete(local_80._M_dataplus._M_p,*plVar3 + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

static void SetString(Field f, Msg& msg, absl::string_view x) {
    RecordAsSeen(f, msg);
    if (f->is_repeated()) {
      msg.msg_->GetReflection()->AddString(msg.msg_, f, std::string(x));
    } else {
      msg.msg_->GetReflection()->SetString(msg.msg_, f, std::string(x));
    }
  }